

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tar_filenames.c
# Opt level: O2

void test_tar_filenames(void)

{
  uint dlen;
  int iVar1;
  int iVar2;
  
  for (iVar1 = 0x2d; iVar1 != 0x37; iVar1 = iVar1 + 1) {
    for (iVar2 = 0x2d; iVar2 != 0x37; iVar2 = iVar2 + 1) {
      test_filename((char *)0x0,iVar1,iVar2);
      test_filename("/",iVar1,iVar2);
    }
  }
  for (dlen = 0; dlen < 0x8c; dlen = dlen + 10) {
    for (iVar1 = 0x62; iVar1 != 0x66; iVar1 = iVar1 + 1) {
      test_filename((char *)0x0,dlen,iVar1);
      test_filename("/",dlen,iVar1);
    }
  }
  for (iVar1 = 0x8c; iVar1 != 0xa0; iVar1 = iVar1 + 1) {
    for (iVar2 = 0x5f; iVar2 != 0x69; iVar2 = iVar2 + 1) {
      test_filename((char *)0x0,iVar1,iVar2);
      test_filename("/",iVar1,iVar2);
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_tar_filenames)
{
	int dlen, flen;

	/* Repeat the following for a variety of dir/file lengths. */
	for (dlen = 45; dlen < 55; dlen++) {
		for (flen = 45; flen < 55; flen++) {
			test_filename(NULL, dlen, flen);
			test_filename("/", dlen, flen);
		}
	}

	for (dlen = 0; dlen < 140; dlen += 10) {
		for (flen = 98; flen < 102; flen++) {
			test_filename(NULL, dlen, flen);
			test_filename("/", dlen, flen);
		}
	}

	for (dlen = 140; dlen < 160; dlen++) {
		for (flen = 95; flen < 105; flen++) {
			test_filename(NULL, dlen, flen);
			test_filename("/", dlen, flen);
		}
	}
}